

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateOneElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlNs **ppxVar1;
  _xmlElementContent *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlElementPtr elemDecl;
  xmlNs *pxVar7;
  xmlChar *pxVar8;
  byte *pbVar9;
  xmlChar *pxVar10;
  char *pcVar11;
  ulong uVar12;
  xmlParserErrors xVar13;
  xmlNodePtr elem_00;
  xmlAttributePtr pxVar14;
  _xmlNode *p_Var15;
  xmlNodePtr in_R8;
  xmlChar *pxVar16;
  _xmlAttr *p_Var17;
  xmlElementContentPtr pxVar18;
  int extsubset;
  xmlChar fn [50];
  xmlChar *str3;
  int local_74;
  xmlElementPtr local_70;
  xmlChar local_68 [56];
  
  local_74 = 0;
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  iVar6 = 1;
  switch(elem->type) {
  case XML_ELEMENT_NODE:
    elemDecl = xmlValidGetElemDecl(ctxt,doc,elem,&local_74);
    if (elemDecl == (xmlElementPtr)0x0) {
      return 0;
    }
    iVar6 = 1;
    if (ctxt->vstateNr != 0) goto switchD_00193b19_caseD_2;
    switch(elemDecl->etype) {
    case XML_ELEMENT_TYPE_UNDEFINED:
      pxVar16 = elem->name;
      pcVar11 = "No declaration for element %s\n";
      xVar13 = XML_DTD_UNKNOWN_ELEM;
      goto LAB_00193ad7;
    case XML_ELEMENT_TYPE_EMPTY:
      if (elem->children == (_xmlNode *)0x0) goto switchD_00193b19_caseD_2;
      pxVar16 = elem->name;
      pcVar11 = "Element %s was declared EMPTY this one has content\n";
      xVar13 = XML_DTD_NOT_EMPTY;
      break;
    default:
      goto switchD_00193b19_caseD_2;
    case XML_ELEMENT_TYPE_MIXED:
      if ((elemDecl->content == (xmlElementContentPtr)0x0) ||
         (elemDecl->content->type != XML_ELEMENT_CONTENT_PCDATA)) {
        p_Var15 = elem->children;
        if (p_Var15 != (_xmlNode *)0x0) {
          iVar6 = 1;
          local_70 = elemDecl;
          do {
            if (p_Var15->type == XML_ELEMENT_NODE) {
              pxVar16 = p_Var15->name;
              pxVar7 = p_Var15->ns;
              if ((pxVar7 != (xmlNs *)0x0) && (pxVar7->prefix != (xmlChar *)0x0)) {
                pxVar10 = xmlBuildQName(p_Var15->name,pxVar7->prefix,local_68,0x32);
                if (pxVar10 == (xmlChar *)0x0) {
                  iVar4 = 1;
                }
                else {
                  for (pxVar18 = elemDecl->content; pxVar18 != (xmlElementContentPtr)0x0;
                      pxVar18 = pxVar18->c2) {
                    if (pxVar18->type == XML_ELEMENT_CONTENT_OR) {
                      p_Var2 = pxVar18->c1;
                      if ((p_Var2 != (_xmlElementContent *)0x0) &&
                         (p_Var2->type == XML_ELEMENT_CONTENT_ELEMENT)) {
                        pxVar8 = p_Var2->name;
                        goto LAB_00193d37;
                      }
                      if ((pxVar18->c1 == (_xmlElementContent *)0x0) ||
                         (pxVar18->c1->type != XML_ELEMENT_CONTENT_PCDATA)) goto LAB_00193d77;
                    }
                    else {
                      if (pxVar18->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00193d77:
                        xmlErrValid((xmlValidCtxtPtr)0x0,XML_DTD_MIXED_CORRUPT,
                                    "Internal: MIXED struct corrupted\n",(char *)0x0);
                        break;
                      }
                      pxVar8 = pxVar18->name;
LAB_00193d37:
                      iVar4 = xmlStrEqual(pxVar8,pxVar10);
                      if (iVar4 != 0) break;
                    }
                  }
                  if ((pxVar10 != local_68) && (pxVar10 != p_Var15->name)) {
                    (*xmlFree)(pxVar10);
                  }
                  iVar4 = ((byte)~(pxVar18 == (xmlElementContentPtr)0x0) & 1) << 3;
                  elemDecl = local_70;
                }
                if (iVar4 == 8) goto LAB_00193e68;
                if (iVar4 != 0) {
                  return 0;
                }
              }
              for (pxVar18 = elemDecl->content; pxVar18 != (xmlElementContentPtr)0x0;
                  pxVar18 = pxVar18->c2) {
                if (pxVar18->type == XML_ELEMENT_CONTENT_OR) {
                  p_Var2 = pxVar18->c1;
                  if ((p_Var2 != (_xmlElementContent *)0x0) &&
                     (p_Var2->type == XML_ELEMENT_CONTENT_ELEMENT)) {
                    pxVar10 = p_Var2->name;
                    goto LAB_00193dfc;
                  }
                  if ((pxVar18->c1 == (_xmlElementContent *)0x0) ||
                     (pxVar18->c1->type != XML_ELEMENT_CONTENT_PCDATA)) goto LAB_00193e52;
                }
                else {
                  if (pxVar18->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00193e52:
                    xmlErrValid(ctxt,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",
                                (char *)0x0);
                    goto LAB_00193e68;
                  }
                  pxVar10 = pxVar18->name;
LAB_00193dfc:
                  iVar4 = xmlStrEqual(pxVar10,pxVar16);
                  if (iVar4 != 0) goto LAB_00193e68;
                }
              }
              xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_CHILD,
                              "Element %s is not declared in %s list of possible children\n",pxVar16
                              ,elem->name,(xmlChar *)0x0);
              iVar6 = 0;
            }
LAB_00193e68:
            p_Var15 = p_Var15->next;
          } while (p_Var15 != (_xmlNode *)0x0);
        }
        goto switchD_00193b19_caseD_2;
      }
      iVar6 = xmlValidateOneCdataElement(ctxt,(xmlDocPtr)elem,elem_00);
      if (iVar6 != 0) goto switchD_00193b19_caseD_2;
      pxVar16 = elem->name;
      pcVar11 = "Element %s was declared #PCDATA but contains non text nodes\n";
      xVar13 = XML_DTD_NOT_PCDATA;
      break;
    case XML_ELEMENT_TYPE_ELEMENT:
      iVar6 = 1;
      if (((doc->standalone == 1) && (local_74 == 1)) &&
         (p_Var15 = elem->children, p_Var15 != (_xmlNode *)0x0)) {
        iVar6 = 1;
        do {
          if (p_Var15->type == XML_TEXT_NODE) {
            for (pbVar9 = p_Var15->content; uVar12 = (ulong)*pbVar9, uVar12 < 0x21;
                pbVar9 = pbVar9 + 1) {
              if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
                if (uVar12 == 0) {
                  in_R8 = (xmlNodePtr)elem->name;
                  iVar6 = 0;
                  xmlErrValidNode(ctxt,elem,XML_DTD_STANDALONE_WHITE_SPACE,
                                  "standalone: %s declared in the external subset contains white spaces nodes\n"
                                  ,(xmlChar *)in_R8,(xmlChar *)0x0,(xmlChar *)0x0);
                  bVar3 = false;
                  goto LAB_00193c6c;
                }
                break;
              }
            }
            bVar3 = true;
LAB_00193c6c:
            if (!bVar3) break;
          }
          p_Var15 = p_Var15->next;
        } while (p_Var15 != (_xmlNode *)0x0);
      }
      iVar4 = xmlValidateElementContent(ctxt,elem->children,elemDecl,(int)elem,in_R8);
      if (iVar4 < 1) {
        iVar6 = iVar4;
      }
      goto switchD_00193b19_caseD_2;
    }
    xmlErrValidNode(ctxt,elem,xVar13,pcVar11,pxVar16,(xmlChar *)0x0,(xmlChar *)0x0);
    iVar6 = 0;
switchD_00193b19_caseD_2:
    pxVar14 = elemDecl->attributes;
    if (pxVar14 == (xmlAttributePtr)0x0) {
      return iVar6;
    }
    ppxVar1 = &elem->nsDef;
    do {
      if (pxVar14->def == XML_ATTRIBUTE_FIXED) {
        if ((pxVar14->prefix == (xmlChar *)0x0) &&
           (iVar4 = xmlStrEqual(pxVar14->name,"xmlns"), pxVar7 = (xmlNs *)ppxVar1, iVar4 != 0)) {
          do {
            pxVar7 = pxVar7->next;
            if (pxVar7 == (xmlNs *)0x0) {
              iVar4 = 0;
              goto LAB_00193968;
            }
          } while (pxVar7->prefix != (xmlChar *)0x0);
          iVar5 = xmlStrEqual(pxVar14->defaultValue,pxVar7->href);
          iVar4 = 0x13;
          if (iVar5 == 0) {
            iVar6 = 0;
            xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_DEFAULT_NAMESPACE,
                            "Element %s namespace name for default namespace does not match the DTD\n"
                            ,elem->name,(xmlChar *)0x0,(xmlChar *)0x0);
          }
LAB_00193968:
          if ((iVar4 != 0) && (iVar4 != 0x13)) {
            return 0;
          }
        }
        else {
          iVar4 = xmlStrEqual(pxVar14->prefix,"xmlns");
          pxVar7 = (xmlNs *)ppxVar1;
          if (iVar4 != 0) {
            do {
              pxVar7 = pxVar7->next;
              if (pxVar7 == (xmlNs *)0x0) {
                iVar4 = 0;
                goto LAB_0019391e;
              }
              iVar4 = xmlStrEqual(pxVar14->name,pxVar7->prefix);
            } while (iVar4 == 0);
            iVar5 = xmlStrEqual(pxVar14->defaultValue,pxVar7->href);
            iVar4 = 0x13;
            if (iVar5 == 0) {
              xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_NAMESPACE,
                              "Element %s namespace name for %s does not match the DTD\n",elem->name
                              ,pxVar7->prefix,(xmlChar *)0x0);
              iVar6 = 0;
            }
LAB_0019391e:
            if ((iVar4 != 0x13) && (iVar4 != 0)) {
              return 0;
            }
          }
        }
      }
      else if (pxVar14->def == XML_ATTRIBUTE_REQUIRED) {
        pxVar7 = (xmlNs *)ppxVar1;
        if ((pxVar14->prefix == (xmlChar *)0x0) &&
           (iVar4 = xmlStrEqual(pxVar14->name,"xmlns"), iVar4 != 0)) {
          do {
            pxVar7 = pxVar7->next;
            if (pxVar7 == (xmlNs *)0x0) {
              iVar4 = 0;
              goto joined_r0x00193910;
            }
          } while (pxVar7->prefix != (xmlChar *)0x0);
          iVar4 = 0x13;
joined_r0x00193910:
          if (pxVar7 == (xmlNs *)0x0) {
            iVar5 = -1;
LAB_001939a3:
            pxVar16 = pxVar14->name;
            if (iVar5 == 0) {
              pxVar10 = elem->name;
              pxVar8 = pxVar14->prefix;
              xVar13 = XML_DTD_NO_PREFIX;
              pcVar11 = "Element %s required attribute %s:%s has no prefix\n";
LAB_00193a18:
              xmlErrValidWarning(ctxt,elem,xVar13,pcVar11,pxVar10,pxVar8,pxVar16);
            }
            else {
              if (iVar5 != -1) {
                pxVar10 = elem->name;
                pxVar8 = pxVar14->prefix;
                xVar13 = XML_DTD_DIFFERENT_PREFIX;
                pcVar11 = "Element %s required attribute %s:%s has different prefix\n";
                goto LAB_00193a18;
              }
              if (pxVar14->prefix == (xmlChar *)0x0) {
                pxVar10 = elem->name;
                str3 = (xmlChar *)0x0;
                pcVar11 = "Element %s does not carry attribute %s\n";
                pxVar8 = pxVar16;
              }
              else {
                pxVar10 = elem->name;
                pcVar11 = "Element %s does not carry attribute %s:%s\n";
                pxVar8 = pxVar14->prefix;
                str3 = pxVar16;
              }
              xmlErrValidNode(ctxt,elem,XML_DTD_MISSING_ATTRIBUTE,pcVar11,pxVar10,pxVar8,str3);
              iVar6 = 0;
            }
            iVar4 = 0;
          }
        }
        else {
          iVar4 = xmlStrEqual(pxVar14->prefix,"xmlns");
          if (iVar4 != 0) {
            do {
              pxVar7 = pxVar7->next;
              if (pxVar7 == (xmlNs *)0x0) {
                iVar4 = 0;
                goto joined_r0x00193910;
              }
              iVar4 = xmlStrEqual(pxVar14->name,pxVar7->prefix);
            } while (iVar4 == 0);
            iVar4 = 0x13;
            goto joined_r0x00193910;
          }
          iVar5 = -1;
          for (p_Var17 = elem->properties; p_Var17 != (_xmlAttr *)0x0; p_Var17 = p_Var17->next) {
            iVar4 = xmlStrEqual(p_Var17->name,pxVar14->name);
            if (iVar4 != 0) {
              if (pxVar14->prefix == (xmlChar *)0x0) {
                iVar4 = 0x13;
                goto LAB_00193994;
              }
              pxVar7 = p_Var17->ns;
              if (pxVar7 == (xmlNs *)0x0) {
                pxVar7 = elem->ns;
              }
              if (pxVar7 == (xmlNs *)0x0) {
                if (iVar5 < 1) {
                  iVar5 = 0;
                }
LAB_001938fa:
                iVar4 = 0;
                bVar3 = true;
              }
              else {
                iVar4 = xmlStrEqual(pxVar7->prefix,pxVar14->prefix);
                if (iVar4 == 0) {
                  iVar5 = 1;
                  goto LAB_001938fa;
                }
                iVar4 = 0x13;
                bVar3 = false;
              }
              if (!bVar3) goto LAB_00193994;
            }
          }
          iVar4 = 0;
LAB_00193994:
          if (iVar4 == 0) goto LAB_001939a3;
        }
        if ((iVar4 != 0) && (iVar4 != 0x13)) {
          return 0;
        }
      }
      pxVar14 = pxVar14->nexth;
      if (pxVar14 == (_xmlAttribute *)0x0) {
        return iVar6;
      }
    } while( true );
  case XML_ATTRIBUTE_NODE:
    pcVar11 = "Attribute element not expected\n";
    break;
  case XML_TEXT_NODE:
    if (elem->children == (_xmlNode *)0x0) {
      if (elem->ns == (xmlNs *)0x0) {
        if (elem->content != (xmlChar *)0x0) {
          return 1;
        }
        pcVar11 = "Text element has no content !\n";
      }
      else {
        pcVar11 = "Text element has namespace !\n";
      }
    }
    else {
      pcVar11 = "Text element has children !\n";
    }
    break;
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    goto switchD_0019366e_caseD_4;
  case XML_ENTITY_NODE:
    pcVar11 = "Entity element not expected\n";
    break;
  case XML_DOCUMENT_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_DOCUMENT_FRAG_NODE:
    pcVar11 = "Document element not expected\n";
    break;
  case XML_NOTATION_NODE:
    pcVar11 = "Notation element not expected\n";
    break;
  case XML_HTML_DOCUMENT_NODE:
    pcVar11 = "HTML Document not expected\n";
    break;
  default:
    pcVar11 = "unknown element type\n";
  }
  xVar13 = XML_ERR_INTERNAL_ERROR;
  pxVar16 = (xmlChar *)0x0;
LAB_00193ad7:
  iVar6 = 0;
  xmlErrValidNode(ctxt,elem,xVar13,pcVar11,pxVar16,(xmlChar *)0x0,(xmlChar *)0x0);
switchD_0019366e_caseD_4:
  return iVar6;
}

Assistant:

int
xmlValidateOneElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                      xmlNodePtr elem) {
    xmlElementPtr elemDecl = NULL;
    xmlElementContentPtr cont;
    xmlAttributePtr attr;
    xmlNodePtr child;
    int ret = 1, tmp;
    const xmlChar *name;
    int extsubset = 0;

    CHECK_DTD;

    if (elem == NULL) return(0);
    switch (elem->type) {
        case XML_ATTRIBUTE_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Attribute element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_TEXT_NODE:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has children !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->ns != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has namespace !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->content == NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has no content !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    return(1);
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            return(1);
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(1);
        case XML_ENTITY_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Entity element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_NOTATION_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Notation element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Document element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_HTML_DOCUMENT_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "HTML Document not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_ELEMENT_NODE:
	    break;
	default:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "unknown element type\n", NULL, NULL ,NULL);
	    return(0);
    }

    /*
     * Fetch the declaration
     */
    elemDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    if (elemDecl == NULL)
	return(0);

    /*
     * If vstateNr is not zero that means continuous validation is
     * activated, do not try to check the content model at that level.
     */
    if (ctxt->vstateNr == 0) {
    /* Check that the element content matches the definition */
    switch (elemDecl->etype) {
        case XML_ELEMENT_TYPE_UNDEFINED:
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ELEM,
	                    "No declaration for element %s\n",
		   elem->name, NULL, NULL);
	    return(0);
        case XML_ELEMENT_TYPE_EMPTY:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
	               elem->name, NULL, NULL);
		ret = 0;
	    }
	    break;
        case XML_ELEMENT_TYPE_ANY:
	    /* I don't think anything is required then */
	    break;
        case XML_ELEMENT_TYPE_MIXED:

	    /* simple case of declared as #PCDATA */
	    if ((elemDecl->content != NULL) &&
		(elemDecl->content->type == XML_ELEMENT_CONTENT_PCDATA)) {
		ret = xmlValidateOneCdataElement(ctxt, doc, elem);
		if (!ret) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
			   elem->name, NULL, NULL);
		}
		break;
	    }
	    child = elem->children;
	    /* Hum, this start to get messy */
	    while (child != NULL) {
	        if (child->type == XML_ELEMENT_NODE) {
		    name = child->name;
		    if ((child->ns != NULL) && (child->ns->prefix != NULL)) {
			xmlChar fn[50];
			xmlChar *fullname;

			fullname = xmlBuildQName(child->name, child->ns->prefix,
				                 fn, 50);
			if (fullname == NULL)
			    return(0);
			cont = elemDecl->content;
			while (cont != NULL) {
			    if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
				if (xmlStrEqual(cont->name, fullname))
				    break;
			    } else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			       (cont->c1 != NULL) &&
			       (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)){
				if (xmlStrEqual(cont->c1->name, fullname))
				    break;
			    } else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
				(cont->c1 == NULL) ||
				(cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)){
				xmlErrValid(NULL, XML_DTD_MIXED_CORRUPT,
					"Internal: MIXED struct corrupted\n",
					NULL);
				break;
			    }
			    cont = cont->c2;
			}
			if ((fullname != fn) && (fullname != child->name))
			    xmlFree(fullname);
			if (cont != NULL)
			    goto child_ok;
		    }
		    cont = elemDecl->content;
		    while (cont != NULL) {
		        if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
			    if (xmlStrEqual(cont->name, name)) break;
			} else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			   (cont->c1 != NULL) &&
			   (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)) {
			    if (xmlStrEqual(cont->c1->name, name)) break;
			} else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
			    (cont->c1 == NULL) ||
			    (cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)) {
			    xmlErrValid(ctxt, XML_DTD_MIXED_CORRUPT,
				    "Internal: MIXED struct corrupted\n",
				    NULL);
			    break;
			}
			cont = cont->c2;
		    }
		    if (cont == NULL) {
			xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
			       name, elem->name, NULL);
			ret = 0;
		    }
		}
child_ok:
	        child = child->next;
	    }
	    break;
        case XML_ELEMENT_TYPE_ELEMENT:
	    if ((doc->standalone == 1) && (extsubset == 1)) {
		/*
		 * VC: Standalone Document Declaration
		 *     - element types with element content, if white space
		 *       occurs directly within any instance of those types.
		 */
		child = elem->children;
		while (child != NULL) {
		    if (child->type == XML_TEXT_NODE) {
			const xmlChar *content = child->content;

			while (IS_BLANK_CH(*content))
			    content++;
			if (*content == 0) {
			    xmlErrValidNode(ctxt, elem,
			                    XML_DTD_STANDALONE_WHITE_SPACE,
"standalone: %s declared in the external subset contains white spaces nodes\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			    break;
			}
		    }
		    child =child->next;
		}
	    }
	    child = elem->children;
	    cont = elemDecl->content;
	    tmp = xmlValidateElementContent(ctxt, child, elemDecl, 1, elem);
	    if (tmp <= 0)
		ret = tmp;
	    break;
    }
    } /* not continuous */

    /* [ VC: Required Attribute ] */
    attr = elemDecl->attributes;
    while (attr != NULL) {
	if (attr->def == XML_ATTRIBUTE_REQUIRED) {
	    int qualified = -1;

	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL)
			goto found;
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix))
			goto found;
		    ns = ns->next;
		}
	    } else {
		xmlAttrPtr attrib;

		attrib = elem->properties;
		while (attrib != NULL) {
		    if (xmlStrEqual(attrib->name, attr->name)) {
			if (attr->prefix != NULL) {
			    xmlNsPtr nameSpace = attrib->ns;

			    if (nameSpace == NULL)
				nameSpace = elem->ns;
			    /*
			     * qualified names handling is problematic, having a
			     * different prefix should be possible but DTDs don't
			     * allow to define the URI instead of the prefix :-(
			     */
			    if (nameSpace == NULL) {
				if (qualified < 0)
				    qualified = 0;
			    } else if (!xmlStrEqual(nameSpace->prefix,
						    attr->prefix)) {
				if (qualified < 1)
				    qualified = 1;
			    } else
				goto found;
			} else {
			    /*
			     * We should allow applications to define namespaces
			     * for their application even if the DTD doesn't
			     * carry one, otherwise, basically we would always
			     * break.
			     */
			    goto found;
			}
		    }
		    attrib = attrib->next;
		}
	    }
	    if (qualified == -1) {
		if (attr->prefix == NULL) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s\n",
			   elem->name, attr->name, NULL);
		    ret = 0;
	        } else {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s:%s\n",
			   elem->name, attr->prefix,attr->name);
		    ret = 0;
		}
	    } else if (qualified == 0) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_NO_PREFIX,
		   "Element %s required attribute %s:%s has no prefix\n",
		       elem->name, attr->prefix, attr->name);
	    } else if (qualified == 1) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_DIFFERENT_PREFIX,
		   "Element %s required attribute %s:%s has different prefix\n",
		       elem->name, attr->prefix, attr->name);
	    }
	} else if (attr->def == XML_ATTRIBUTE_FIXED) {
	    /*
	     * Special tests checking #FIXED namespace declarations
	     * have the right value since this is not done as an
	     * attribute checking
	     */
	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem,
			           XML_DTD_ELEM_DEFAULT_NAMESPACE,
   "Element %s namespace name for default namespace does not match the DTD\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix)) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Element %s namespace name for %s does not match the DTD\n",
				   elem->name, ns->prefix, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    }
	}
found:
        attr = attr->nexth;
    }
    return(ret);
}